

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflector.h
# Opt level: O2

Matrix<60,_60> __thiscall
singular::Reflector<60>::applyFromRightTo<60>(Reflector<60> *this,Matrix<60,_60> *m)

{
  double *pdVar1;
  int in_ECX;
  __fn *in_RDX;
  double *pdVar2;
  void *in_R8;
  size_t start;
  int i;
  long lVar3;
  double dVar4;
  general_iterator<const_double> __first2;
  general_iterator<double> __result;
  Vector<double> dstRow;
  Vector<const_double> srcRow;
  Vector<double> local_78;
  Vector<const_double> local_60;
  Vector<double> local_48;
  
  Matrix<60,_60>::clone((Matrix<60,_60> *)this,in_RDX,in_RDX,in_ECX,in_R8);
  start = ((long)m->pBlock - (long)m[1].pBlock) * 0x20000000 + 0x3c00000000 >> 0x20;
  for (lVar3 = 0; lVar3 != 0x3c; lVar3 = lVar3 + 1) {
    local_78.pBlock = (double *)(*(long *)in_RDX + lVar3 * 0x1e0);
    local_78.len = 0x3c;
    local_78.delta = 1;
    Vector<const_double>::slice(&local_60,(Vector<const_double> *)&local_78,start);
    dVar4 = 0.0;
    pdVar2 = local_60.pBlock;
    for (pdVar1 = m->pBlock; pdVar1 != m[1].pBlock; pdVar1 = pdVar1 + 1) {
      dVar4 = dVar4 + *pdVar1 * *pdVar2;
      pdVar2 = pdVar2 + local_60.delta;
    }
    local_48.pBlock =
         (this->u).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3 * 0x3c;
    pdVar1 = m[3].pBlock;
    local_48.len = 0x3c;
    local_48.delta = 1;
    Vector<double>::slice(&local_78,&local_48,start);
    __first2.delta = local_60.delta;
    __first2.ptr = local_60.pBlock;
    __result.delta = local_78.delta;
    __result.ptr = local_78.pBlock;
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,singular::Vector<double_const>::general_iterator<double_const>,singular::Vector<double>::general_iterator<double>,singular::Reflector<60>::applyFromRightTo<60>(singular::Matrix<60,60>const&)const::_lambda(double,double)_1_>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               m->pBlock,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               m[1].pBlock,__first2,__result,(anon_class_8_1_ba1d47af)(dVar4 * (double)pdVar1));
  }
  return (Matrix<60,_60>)(double *)this;
}

Assistant:

Matrix< M, L > applyFromRightTo(const Matrix< M, L >& m) const {
			// m * H = m - m * gamma * u * u^T
			Matrix< M, L > m2 = m.clone();
			int offset = L - u.size();
			for (int i = 0; i < M; ++i) {
				// caches gamma * m * u
				Vector< const double > srcRow = m.row(i).slice(offset);
				double gMU = std::inner_product(
					this->u.begin(), this->u.end(), srcRow.begin(), 0.0);
				gMU *= this->gamma;
				// m * H = m - gMU * u^T
				Vector< double > dstRow = m2.row(i).slice(offset);
				std::transform(
					this->u.begin(), this->u.end(), srcRow.begin(),
					dstRow.begin(),
					[gMU](double a, double b) {
						return b - gMU * a;
					});
			}
			return m2;
		}